

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_6d7a8::ParserImpl::ParseArgs(ParserImpl *this)

{
  String *pSVar1;
  undefined8 uVar2;
  _Manager_type p_Var3;
  int iVar4;
  Lexer *pLVar5;
  TokenDetail *pTVar6;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> uVar7;
  ParseException *this_00;
  undefined4 uVar8;
  ParserImpl *in_RSI;
  Lexer *local_30;
  
  pTVar6 = &in_RSI->look_ahead_;
  iVar4 = (in_RSI->look_ahead_).token_;
  if (iVar4 == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,pTVar6);
    iVar4 = (in_RSI->look_ahead_).token_;
  }
  if (iVar4 == 0x116) {
    pLVar5 = (Lexer *)operator_new(0x30);
    pTVar6 = NextToken(in_RSI);
    pLVar5->state_ = (State *)&PTR__SyntaxTree_00154298;
    pSVar1 = pTVar6->module_;
    uVar2 = *(undefined8 *)&pTVar6->line_;
    p_Var3 = *(_Manager_type *)&pTVar6->token_;
    pLVar5->module_ = (String *)pTVar6->field_0;
    *(String **)&(pLVar5->in_stream_).super__Function_base._M_functor = pSVar1;
    *(undefined8 *)((long)&(pLVar5->in_stream_).super__Function_base._M_functor + 8) = uVar2;
    (pLVar5->in_stream_).super__Function_base._M_manager = p_Var3;
    (pLVar5->in_stream_)._M_invoker = (_Invoker_type)0x0;
    uVar8 = 2;
  }
  else {
    if (iVar4 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar6);
      iVar4 = (in_RSI->look_ahead_).token_;
    }
    if (iVar4 == 0x7b) {
      ParseTableConstructor((ParserImpl *)&stack0xffffffffffffffd0);
      uVar8 = 1;
      pLVar5 = local_30;
    }
    else {
      if (iVar4 == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar6);
        iVar4 = (in_RSI->look_ahead_).token_;
      }
      if (iVar4 != 0x28) {
        __assert_fail("LookAhead().token_ == Token_String || LookAhead().token_ == \'{\' || LookAhead().token_ == \'(\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x2c4,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseArgs()");
      }
      NextToken(in_RSI);
      iVar4 = (in_RSI->look_ahead_).token_;
      if (iVar4 == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar6);
        iVar4 = (in_RSI->look_ahead_).token_;
      }
      if (iVar4 == 0x29) {
        local_30 = (Lexer *)0x0;
      }
      else {
        ParseExpList((ParserImpl *)&stack0xffffffffffffffd0);
      }
      pTVar6 = NextToken(in_RSI);
      uVar8 = 0;
      pLVar5 = local_30;
      if (pTVar6->token_ != 0x29) {
        this_00 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (this_00,"expect \')\' to end function call args",&in_RSI->current_);
        __cxa_throw(this_00,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
    }
  }
  uVar7._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
  super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
       (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
       operator_new(0x18);
  *(undefined ***)
   uVar7._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
   super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl = &PTR__FuncCallArgs_00154618;
  *(Lexer **)
   ((long)uVar7._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
          ._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 8) = pLVar5;
  *(undefined4 *)
   ((long)uVar7._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
          ._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x10) = uVar8;
  *(undefined4 *)
   ((long)uVar7._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
          ._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x14) = 0;
  this->lexer_ = (Lexer *)uVar7._M_t.
                          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                          .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
         uVar7._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
         _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseArgs()
        {
            assert(LookAhead().token_ == Token_String ||
                   LookAhead().token_ == '{' ||
                   LookAhead().token_ == '(');

            std::unique_ptr<SyntaxTree> arg;
            FuncCallArgs::ArgType type;

            if (LookAhead().token_ == Token_String)
            {
                type = FuncCallArgs::String;
                arg.reset(new Terminator(NextToken()));
            }
            else if (LookAhead().token_ == '{')
            {
                type = FuncCallArgs::Table;
                arg = ParseTableConstructor();
            }
            else
            {
                type = FuncCallArgs::ExpList;
                NextToken();            // skip '('
                if (LookAhead().token_ != ')')
                    arg = ParseExpList();

                if (NextToken().token_ != ')')
                    throw ParseException("expect ')' to end function call args", current_);
            }

            return std::unique_ptr<SyntaxTree>(new FuncCallArgs(std::move(arg), type));
        }